

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_add_scalar_property(p_ply ply,char *name,e_ply_type type)

{
  size_t sVar1;
  p_ply_property_conflict __dest;
  e_ply_type in_EDX;
  char *in_RSI;
  p_ply in_RDI;
  p_ply_property_conflict property;
  p_ply_element element;
  p_ply_element element_00;
  int local_4;
  
  element_00 = (p_ply_element)0x0;
  sVar1 = strlen(in_RSI);
  if ((sVar1 < 0x100) && ((int)in_EDX < 0x10)) {
    __dest = ply_grow_property((p_ply)(in_RDI->element + in_RDI->nelements + -1),element_00);
    if (__dest == (p_ply_property_conflict)0x0) {
      local_4 = 0;
    }
    else {
      strcpy(__dest->name,in_RSI);
      __dest->type = in_EDX;
      local_4 = 1;
    }
  }
  else {
    ply_ferror(in_RDI,"Invalid arguments");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ply_add_scalar_property(p_ply ply, const char *name, e_ply_type type) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE);
    assert(type < PLY_LIST);
    if (strlen(name) >= WORDSIZE || type >= PLY_LIST) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = &ply->element[ply->nelements - 1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    strcpy(property->name, name);
    property->type = type;
    return 1;
}